

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::move_right(Fl_Text_Display *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = this->mCursorPos;
  bVar1 = iVar2 < this->mBuffer->mLength;
  if (bVar1) {
    iVar2 = Fl_Text_Buffer::next_char(this->mBuffer,iVar2);
    insert_position(this,iVar2);
  }
  return (uint)bVar1;
}

Assistant:

int Fl_Text_Display::move_right() {
  if ( mCursorPos >= mBuffer->length() )
    return 0;
  int p = insert_position();
  int q = buffer()->next_char(p);
  insert_position(q);
  return 1;
}